

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O0

void __thiscall fasttext::ProductQuantizer::train(ProductQuantizer *this,int32_t n,real *x)

{
  invalid_argument *this_00;
  int *piVar1;
  size_type __n;
  float *pfVar2;
  reference pvVar3;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int j;
  int m;
  vector<float,_std::allocator<float>_> xslice;
  int np;
  int32_t d;
  vector<int,_std::allocator<int>_> perm;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffea8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffeb0;
  ProductQuantizer *in_stack_fffffffffffffeb8;
  allocator_type *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed0;
  vector<float,_std::allocator<float>_> *this_01;
  int local_f4;
  int local_e0;
  vector<float,_std::allocator<float>_> local_d9;
  int local_c0;
  int local_bc;
  int *local_b8;
  int *local_b0;
  undefined4 local_a4;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_stack_ffffffffffffff60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff70;
  int32_t in_stack_ffffffffffffff88;
  int32_t in_stack_ffffffffffffff8c;
  real *in_stack_ffffffffffffff90;
  real *in_stack_ffffffffffffff98;
  ProductQuantizer *in_stack_ffffffffffffffa0;
  string local_38 [32];
  int *local_18;
  int local_c [3];
  
  if (in_ESI < *(int *)(in_RDI + 4)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string((int)((ulong)this_00 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffeb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffeb0._M_current);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0._M_current);
    std::invalid_argument::invalid_argument(this_00,local_38);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_a4 = 0;
  local_18 = in_RDX;
  local_c[0] = in_ESI;
  std::allocator<int>::allocator((allocator<int> *)0x1e2883);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (value_type_conflict *)in_stack_fffffffffffffec0,
             (allocator_type *)in_stack_fffffffffffffeb8);
  std::allocator<int>::~allocator((allocator<int> *)0x1e28b1);
  local_b0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              (in_stack_fffffffffffffea8._M_current);
  local_b8 = (int *)std::vector<int,_std::allocator<int>_>::end
                              (in_stack_fffffffffffffea8._M_current);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0);
  local_bc = *(int *)(in_RDI + 0x24);
  piVar1 = std::min<int>(local_c,(int *)(in_RDI + 0xc));
  local_c0 = *piVar1;
  __n = (size_type)(local_c0 * *(int *)(in_RDI + 0x24));
  this_01 = &local_d9;
  std::allocator<float>::allocator((allocator<float> *)0x1e2953);
  std::vector<float,_std::allocator<float>_>::vector(this_01,__n,in_stack_fffffffffffffec0);
  std::allocator<float>::~allocator((allocator<float> *)0x1e2976);
  for (local_e0 = 0; local_e0 < *(int *)(in_RDI + 0x20); local_e0 = local_e0 + 1) {
    if (local_e0 == *(int *)(in_RDI + 0x20) + -1) {
      local_bc = *(int *)(in_RDI + 0x28);
    }
    if (local_c0 != local_c[0]) {
      in_stack_fffffffffffffec0 = (allocator_type *)&stack0xffffffffffffff60;
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea8._M_current);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea8._M_current);
      std::
      shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>&>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    }
    for (local_f4 = 0; local_f4 < local_c0; local_f4 = local_f4 + 1) {
      pfVar2 = std::vector<float,_std::allocator<float>_>::data
                         ((vector<float,_std::allocator<float>_> *)0x1e2ab4);
      in_stack_fffffffffffffeb8 = (ProductQuantizer *)(pfVar2 + local_f4 * local_bc);
      in_stack_fffffffffffffeb0._M_current = local_18;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff60,
                          (long)local_f4);
      memcpy(in_stack_fffffffffffffeb8,
             in_stack_fffffffffffffeb0._M_current +
             (long)(*pvVar3 * *(int *)(in_RDI + 0x1c)) + (long)(local_e0 * *(int *)(in_RDI + 0x24)),
             (long)local_bc << 2);
    }
    in_stack_fffffffffffffea8._M_current =
         (int *)std::vector<float,_std::allocator<float>_>::data
                          ((vector<float,_std::allocator<float>_> *)0x1e2b4b);
    get_centroids(in_stack_fffffffffffffeb8,
                  (int32_t)((ulong)in_stack_fffffffffffffeb0._M_current >> 0x20),
                  (uint8_t)((ulong)in_stack_fffffffffffffeb0._M_current >> 0x18));
    kmeans(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
           in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffec0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0);
  return;
}

Assistant:

void ProductQuantizer::train(int32_t n, const real* x) {
  if (n < ksub_) {
    throw std::invalid_argument(
        "Matrix too small for quantization, must have at least " +
        std::to_string(ksub_) + " rows");
  }
  std::vector<int32_t> perm(n, 0);
  std::iota(perm.begin(), perm.end(), 0);
  auto d = dsub_;
  auto np = std::min(n, max_points_);
  auto xslice = std::vector<real>(np * dsub_);
  for (auto m = 0; m < nsubq_; m++) {
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    if (np != n) {
      std::shuffle(perm.begin(), perm.end(), rng);
    }
    for (auto j = 0; j < np; j++) {
      memcpy(
          xslice.data() + j * d,
          x + perm[j] * dim_ + m * dsub_,
          d * sizeof(real));
    }
    kmeans(xslice.data(), get_centroids(m, 0), np, d);
  }
}